

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O0

size_t FStringTable::ProcessEscapes(char *iptr)

{
  char *pcVar1;
  char local_21;
  char *pcStack_20;
  char c;
  char *optr;
  char *sptr;
  char *iptr_local;
  
  pcStack_20 = iptr;
  sptr = iptr;
  do {
    pcVar1 = sptr + 1;
    local_21 = *sptr;
    if (local_21 == '\0') {
      *pcStack_20 = '\0';
      return (long)pcStack_20 - (long)iptr;
    }
    if (local_21 != '\\') goto LAB_0065e3f9;
    sptr = sptr + 2;
    local_21 = *pcVar1;
    pcVar1 = sptr;
    if (local_21 == 'n') {
      local_21 = '\n';
      goto LAB_0065e3f9;
    }
    if (local_21 == 'c') {
      local_21 = '\x1c';
      goto LAB_0065e3f9;
    }
    if (local_21 == 'r') {
      local_21 = '\r';
      goto LAB_0065e3f9;
    }
    if (local_21 == 't') {
      local_21 = '\t';
      goto LAB_0065e3f9;
    }
    if (local_21 != '\n') {
LAB_0065e3f9:
      sptr = pcVar1;
      *pcStack_20 = local_21;
      pcStack_20 = pcStack_20 + 1;
    }
  } while( true );
}

Assistant:

size_t FStringTable::ProcessEscapes (char *iptr)
{
	char *sptr = iptr, *optr = iptr, c;

	while ((c = *iptr++) != '\0')
	{
		if (c == '\\')
		{
			c = *iptr++;
			if (c == 'n')
				c = '\n';
			else if (c == 'c')
				c = TEXTCOLOR_ESCAPE;
			else if (c == 'r')
				c = '\r';
			else if (c == 't')
				c = '\t';
			else if (c == '\n')
				continue;
		}
		*optr++ = c;
	}
	*optr = '\0';
	return optr - sptr;
}